

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

LZ4_stream_t * LZ4_initStream(void *buffer,size_t size)

{
  int iVar1;
  size_t alignment;
  size_t size_local;
  void *buffer_local;
  
  if (buffer == (void *)0x0) {
    buffer_local = (void *)0x0;
  }
  else if (size < 0x4020) {
    buffer_local = (void *)0x0;
  }
  else {
    alignment = LZ4_stream_t_alignment();
    iVar1 = LZ4_isAligned(buffer,alignment);
    if (iVar1 == 0) {
      buffer_local = (void *)0x0;
    }
    else {
      memset(buffer,0,0x4020);
      buffer_local = buffer;
    }
  }
  return (LZ4_stream_t *)buffer_local;
}

Assistant:

LZ4_stream_t* LZ4_initStream (void* buffer, size_t size)
{
    DEBUGLOG(5, "LZ4_initStream");
    if (buffer == NULL) { return NULL; }
    if (size < sizeof(LZ4_stream_t)) { return NULL; }
    if (!LZ4_isAligned(buffer, LZ4_stream_t_alignment())) return NULL;
    MEM_INIT(buffer, 0, sizeof(LZ4_stream_t_internal));
    return (LZ4_stream_t*)buffer;
}